

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O1

DecodePsbtResponseStruct * __thiscall
cfd::api::json::DecodePsbtResponse::ConvertToStruct
          (DecodePsbtResponseStruct *__return_storage_ptr__,DecodePsbtResponse *this)

{
  _Rb_tree_header *p_Var1;
  vector<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_> local_108;
  undefined1 local_e8 [32];
  _Alloc_hider local_c8;
  char local_b8 [32];
  uint32_t local_98;
  vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_> local_90;
  vector<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_> local_78
  ;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_60;
  
  (__return_storage_ptr__->tx).txid._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->tx).txid.field_2;
  (__return_storage_ptr__->tx).txid._M_string_length = 0;
  (__return_storage_ptr__->tx).txid.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->tx).hash._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->tx).hash.field_2;
  (__return_storage_ptr__->tx).hash._M_string_length = 0;
  (__return_storage_ptr__->tx).hash.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(__return_storage_ptr__->tx).ignore_items._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->tx).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->tx).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->tx).version = 0;
  (__return_storage_ptr__->tx).size = 0;
  (__return_storage_ptr__->tx).vsize = 0;
  (__return_storage_ptr__->tx).weight = 0;
  (__return_storage_ptr__->tx).locktime = 0;
  (__return_storage_ptr__->tx).vin.
  super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->tx).vin.
  super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->tx).vin.
  super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->tx).vout.
  super__Vector_base<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->tx).vout.
  super__Vector_base<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->tx).vout.
  super__Vector_base<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->tx).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->tx).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->tx).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (__return_storage_ptr__->tx_hex)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->tx_hex).field_2;
  (__return_storage_ptr__->tx_hex)._M_string_length = 0;
  (__return_storage_ptr__->tx_hex).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->xpubs).
           super__Vector_base<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->xpubs).
           super__Vector_base<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (__return_storage_ptr__->xpubs).
  super__Vector_base<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->xpubs).
  super__Vector_base<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->outputs).
  super__Vector_base<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->fee = 0;
  (__return_storage_ptr__->outputs).
  super__Vector_base<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->outputs).
  super__Vector_base<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->inputs).
  super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->inputs).
  super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->unknown).
  super__Vector_base<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->inputs).
  super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->unknown).
  super__Vector_base<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->unknown).
  super__Vector_base<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  DecodeRawTransactionResponse::ConvertToStruct
            ((DecodeRawTransactionResponseStruct *)local_e8,&this->tx_);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_e8);
  std::__cxx11::string::operator=((string *)&(__return_storage_ptr__->tx).hash,(string *)&local_c8);
  (__return_storage_ptr__->tx).locktime = local_98;
  *(undefined8 *)&(__return_storage_ptr__->tx).version = local_b8._16_8_;
  *(undefined8 *)&(__return_storage_ptr__->tx).vsize = local_b8._24_8_;
  local_108.super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)(__return_storage_ptr__->tx).vin.
                super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_108.super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)(__return_storage_ptr__->tx).vin.
                super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_108.super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(__return_storage_ptr__->tx).vin.
                super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->tx).vin.
  super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_90.
       super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->tx).vin.
  super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_90.
       super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->tx).vin.
  super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_90.
       super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_90.
  super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.
  super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.
  super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>::
  ~vector((vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_> *
          )&local_108);
  local_108.super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)(__return_storage_ptr__->tx).vout.
                super__Vector_base<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_108.super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)(__return_storage_ptr__->tx).vout.
                super__Vector_base<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_108.super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(__return_storage_ptr__->tx).vout.
                super__Vector_base<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->tx).vout.
  super__Vector_base<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_78.
       super__Vector_base<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->tx).vout.
  super__Vector_base<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_78.
       super__Vector_base<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->tx).vout.
  super__Vector_base<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_78.
       super__Vector_base<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_78.
  super__Vector_base<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>::
  ~vector((vector<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
           *)&local_108);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->tx).ignore_items._M_t);
  if (_Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &_Stack_60._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->tx).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_color
         = _Stack_60._M_impl.super__Rb_tree_header._M_header._M_color;
    (__return_storage_ptr__->tx).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
         = _Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    (__return_storage_ptr__->tx).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left;
    (__return_storage_ptr__->tx).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_right
         = _Stack_60._M_impl.super__Rb_tree_header._M_header._M_right;
    (_Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &(__return_storage_ptr__->tx).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header;
    (__return_storage_ptr__->tx).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count =
         _Stack_60._M_impl.super__Rb_tree_header._M_node_count;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&_Stack_60);
  std::vector<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>::
  ~vector(&local_78);
  std::vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>::
  ~vector(&local_90);
  if (local_c8._M_p != local_b8) {
    operator_delete(local_c8._M_p);
  }
  if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
    operator_delete((void *)local_e8._0_8_);
  }
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->tx_hex);
  core::JsonObjectVector<cfd::api::json::PsbtGlobalXpub,_PsbtGlobalXpubStruct>::ConvertToStruct
            ((vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_> *)&local_108,
             &this->xpubs_);
  local_e8._0_8_ =
       (__return_storage_ptr__->xpubs).
       super__Vector_base<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_e8._8_8_ =
       (__return_storage_ptr__->xpubs).
       super__Vector_base<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_e8._16_8_ =
       (__return_storage_ptr__->xpubs).
       super__Vector_base<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->xpubs).
  super__Vector_base<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_108.
                super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>.
                _M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->xpubs).
  super__Vector_base<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_108.
                super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->xpubs).
  super__Vector_base<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_108.
                super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_108.super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_>::~vector
            ((vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_> *)local_e8);
  std::vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_>::~vector
            ((vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_> *)&local_108);
  __return_storage_ptr__->version = this->version_;
  core::JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct>::ConvertToStruct
            ((vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *)&local_108,
             &this->unknown_);
  local_e8._0_8_ =
       (__return_storage_ptr__->unknown).
       super__Vector_base<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_e8._8_8_ =
       (__return_storage_ptr__->unknown).
       super__Vector_base<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_e8._16_8_ =
       (__return_storage_ptr__->unknown).
       super__Vector_base<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->unknown).
  super__Vector_base<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_108.
                super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>.
                _M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->unknown).
  super__Vector_base<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_108.
                super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->unknown).
  super__Vector_base<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_108.
                super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_108.super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>::~vector
            ((vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *)local_e8);
  std::vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>::~vector
            ((vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *)&local_108);
  core::JsonObjectVector<cfd::api::json::DecodePsbtInput,_DecodePsbtInputStruct>::ConvertToStruct
            (&local_108,&this->inputs_);
  local_e8._0_8_ =
       (__return_storage_ptr__->inputs).
       super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_e8._8_8_ =
       (__return_storage_ptr__->inputs).
       super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_e8._16_8_ =
       (__return_storage_ptr__->inputs).
       super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->inputs).
  super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_108.super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->inputs).
  super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_108.super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->inputs).
  super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_108.super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_108.super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>::~vector
            ((vector<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_> *)local_e8);
  std::vector<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>::~vector(&local_108);
  core::JsonObjectVector<cfd::api::json::DecodePsbtOutput,_DecodePsbtOutputStruct>::ConvertToStruct
            ((vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_> *)&local_108,
             &this->outputs_);
  local_e8._0_8_ =
       (__return_storage_ptr__->outputs).
       super__Vector_base<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_e8._8_8_ =
       (__return_storage_ptr__->outputs).
       super__Vector_base<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_e8._16_8_ =
       (__return_storage_ptr__->outputs).
       super__Vector_base<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->outputs).
  super__Vector_base<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_108.
                super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>.
                _M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->outputs).
  super__Vector_base<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_108.
                super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->outputs).
  super__Vector_base<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_108.
                super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_108.super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_>::~vector
            ((vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_> *)local_e8);
  std::vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_>::~vector
            ((vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_> *)&local_108);
  __return_storage_ptr__->fee = this->fee_;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

DecodePsbtResponseStruct DecodePsbtResponse::ConvertToStruct() const {  // NOLINT
  DecodePsbtResponseStruct result;
  result.tx = tx_.ConvertToStruct();
  result.tx_hex = tx_hex_;
  result.xpubs = xpubs_.ConvertToStruct();
  result.version = version_;
  result.unknown = unknown_.ConvertToStruct();
  result.inputs = inputs_.ConvertToStruct();
  result.outputs = outputs_.ConvertToStruct();
  result.fee = fee_;
  result.ignore_items = ignore_items;
  return result;
}